

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3OsOpenMalloc(sqlite3_vfs *pVfs,char *zFile,sqlite3_file **ppFile,int flags,int *pOutFlags
                       )

{
  int iVar1;
  sqlite3_file *__s;
  int iVar2;
  
  iVar1 = pVfs->szOsFile;
  __s = (sqlite3_file *)sqlite3Malloc(iVar1);
  if (__s == (sqlite3_file *)0x0) {
    iVar2 = 7;
  }
  else {
    iVar2 = 0;
    memset(__s,0,(long)iVar1);
    iVar1 = (*pVfs->xOpen)(pVfs,zFile,__s,flags & 0x87f7f,pOutFlags);
    if (iVar1 == 0) {
      *ppFile = __s;
    }
    else {
      sqlite3_free(__s);
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsOpenMalloc(
  sqlite3_vfs *pVfs, 
  const char *zFile, 
  sqlite3_file **ppFile, 
  int flags,
  int *pOutFlags
){
  int rc = SQLITE_NOMEM;
  sqlite3_file *pFile;
  pFile = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if( pFile ){
    rc = sqlite3OsOpen(pVfs, zFile, pFile, flags, pOutFlags);
    if( rc!=SQLITE_OK ){
      sqlite3_free(pFile);
    }else{
      *ppFile = pFile;
    }
  }
  return rc;
}